

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::Jacobian
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,TPZFMatrix<double> *coord,TPZVec<double> *par,
          TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv)

{
  TPZGeoEl *pTVar1;
  TPZGeoMesh *gmesh;
  long lVar2;
  double *pdVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  int a_1;
  int b;
  int iVar11;
  int a;
  ulong uVar12;
  double dVar13;
  TPZGeoElSide neighbyside;
  REAL Det;
  TPZFNMatrix<9,_double> axest;
  TPZStack<int,_10> LowNodeSides;
  TPZManVector<double,_3> NeighPar;
  TPZManVector<double,_3> DblendTemp;
  TPZManVector<double,_3> Xside;
  TPZStack<int,_10> LowAllSides;
  TPZFNMatrix<9,_double> JacTemp;
  TPZFNMatrix<9,_double> J1;
  TPZManVector<double,_10> SidesCounter;
  TPZManVector<double,_3> XNode;
  TPZManVector<double,_3> SidePar;
  TPZManVector<double,_10> parChanged;
  TPZFNMatrix<24,_double> Dblend;
  TPZFNMatrix<24,_double> blend;
  TPZFNMatrix<9,_double> Jneighbourhood;
  TPZFNMatrix<9,_double> J2;
  TPZFNMatrix<9,_double> Ax;
  double local_b28;
  TPZGeoElSide local_ac8;
  REAL local_ab0;
  TPZFMatrix<double> local_aa8;
  double local_a18 [10];
  TPZManVector<int,_10> local_9c8;
  TPZManVector<double,_3> local_980;
  TPZManVector<double,_3> local_948;
  TPZManVector<double,_3> local_910;
  TPZManVector<int,_10> local_8d8;
  TPZFMatrix<double> local_890;
  double local_800 [10];
  TPZFMatrix<double> local_7b0;
  double local_720 [10];
  TPZManVector<double,_10> local_6d0;
  TPZManVector<double,_3> local_660;
  TPZManVector<double,_3> local_628;
  TPZManVector<double,_10> local_5f0;
  TPZFMatrix<double> local_580;
  double local_4f0 [25];
  TPZFMatrix<double> local_428;
  double local_398 [25];
  TPZFMatrix<double> local_2d0;
  double local_240 [10];
  TPZFMatrix<double> local_1f0;
  double local_160 [10];
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  pTVar1 = this->fGeoEl;
  TPZManVector<double,_3>::TPZManVector(&local_980,0);
  TPZManVector<double,_3>::TPZManVector(&local_628,0);
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_910,3,(double *)&local_428);
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_660,3,(double *)&local_428);
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&local_6d0,7,(double *)&local_428);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_9c8);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_8d8);
  local_428.fElem = local_398;
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01885290;
  local_428.fSize = 0x18;
  local_428.fGiven = local_428.fElem;
  TPZVec<int>::TPZVec(&local_428.fPivot.super_TPZVec<int>,0);
  local_428.fPivot.super_TPZVec<int>.fStore = local_428.fPivot.fExtAlloc;
  local_428.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_428.fPivot.super_TPZVec<int>.fNElements = 0;
  local_428.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_428.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_428.fWork.fStore = (double *)0x0;
  local_428.fWork.fNElements = 0;
  local_428.fWork.fNAlloc = 0;
  local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01884fa0;
  local_580.fElem = local_4f0;
  local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01885290;
  local_580.fSize = 0x18;
  local_580.fGiven = local_580.fElem;
  TPZVec<int>::TPZVec(&local_580.fPivot.super_TPZVec<int>,0);
  local_580.fPivot.super_TPZVec<int>.fStore = local_580.fPivot.fExtAlloc;
  local_580.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_580.fPivot.super_TPZVec<int>.fNElements = 0;
  local_580.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_580.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_580.fWork.fStore = (double *)0x0;
  local_580.fWork.fNElements = 0;
  local_580.fWork.fNAlloc = 0;
  local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01884fa0;
  pztopology::TPZTriangle::TShape<double>(par,&local_428,&local_580);
  local_7b0.fElem = local_720;
  local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_7b0.fSize = 9;
  local_7b0.fGiven = local_7b0.fElem;
  TPZVec<int>::TPZVec(&local_7b0.fPivot.super_TPZVec<int>,0);
  local_7b0.fPivot.super_TPZVec<int>.fStore = local_7b0.fPivot.fExtAlloc;
  local_7b0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_7b0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_7b0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_7b0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_7b0.fWork.fStore = (double *)0x0;
  local_7b0.fWork.fNElements = 0;
  local_7b0.fWork.fNAlloc = 0;
  local_7b0.fElem = (double *)0x0;
  local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  local_1f0.fElem = local_160;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_1f0.fSize = 9;
  local_1f0.fGiven = local_1f0.fElem;
  TPZVec<int>::TPZVec(&local_1f0.fPivot.super_TPZVec<int>,0);
  local_1f0.fPivot.super_TPZVec<int>.fStore = local_1f0.fPivot.fExtAlloc;
  local_1f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1f0.fWork.fStore = (double *)0x0;
  local_1f0.fWork.fNElements = 0;
  local_1f0.fWork.fNAlloc = 0;
  local_1f0.fElem = (double *)0x0;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  local_110.fElem = local_80;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_110.fSize = 9;
  local_110.fGiven = local_110.fElem;
  TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
  local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
  local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_110.fPivot.super_TPZVec<int>.fNElements = 0;
  local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_110.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_110.fWork.fStore = (double *)0x0;
  local_110.fWork.fNElements = 0;
  local_110.fWork.fNAlloc = 0;
  local_110.fElem = (double *)0x0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  local_890.fElem = local_800;
  local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_890.fSize = 9;
  local_890.fGiven = local_890.fElem;
  TPZVec<int>::TPZVec(&local_890.fPivot.super_TPZVec<int>,0);
  local_890.fPivot.super_TPZVec<int>.fStore = local_890.fPivot.fExtAlloc;
  local_890.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_890.fPivot.super_TPZVec<int>.fNElements = 0;
  local_890.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_890.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_890.fWork.fStore = (double *)0x0;
  local_890.fWork.fNElements = 0;
  local_890.fWork.fNAlloc = 0;
  local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  TPZFMatrix<double>::operator=(&local_890,0.0);
  local_2d0.fElem = local_240;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_2d0.fSize = 9;
  local_2d0.fGiven = local_2d0.fElem;
  TPZVec<int>::TPZVec(&local_2d0.fPivot.super_TPZVec<int>,0);
  local_2d0.fPivot.super_TPZVec<int>.fStore = local_2d0.fPivot.fExtAlloc;
  local_2d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_2d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_2d0.fWork.fStore = (double *)0x0;
  local_2d0.fWork.fNElements = 0;
  local_2d0.fWork.fNAlloc = 0;
  local_2d0.fElem = (double *)0x0;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  gmesh = pTVar1->fMesh;
  uVar12 = 6;
  do {
    iVar11 = (int)uVar12;
    Neighbour(&local_ac8,this,iVar11,gmesh);
    if ((local_ac8.fGeoEl != (TPZGeoEl *)0x0) && (-1 < local_ac8.fSide)) {
      pztopology::TPZTriangle::LowerDimensionSides(iVar11,(TPZStack<int,_10> *)&local_9c8,0);
      pztopology::TPZTriangle::LowerDimensionSides(iVar11,(TPZStack<int,_10> *)&local_8d8);
      Neighbour((TPZGeoElSide *)&local_aa8,this,iVar11,gmesh);
      iVar5 = TPZGeoElSide::Dimension((TPZGeoElSide *)&local_aa8);
      lVar6 = (long)iVar5;
      local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_01816238;
      local_aa8.fElem = local_a18;
      local_aa8.fSize = 9;
      local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar6;
      local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar6;
      local_aa8.fGiven = local_aa8.fElem;
      TPZVec<int>::TPZVec(&local_aa8.fPivot.super_TPZVec<int>,0);
      local_aa8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_aa8.fPivot.super_TPZVec<int>.fStore = local_aa8.fPivot.fExtAlloc;
      local_aa8.fPivot.super_TPZVec<int>.fNElements = 0;
      local_aa8.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_aa8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_aa8.fWork.fStore = (double *)0x0;
      local_aa8.fWork.fNElements = 0;
      local_aa8.fWork.fNAlloc = 0;
      if (iVar5 == 0) {
        local_aa8.fElem = (double *)0x0;
      }
      else {
        uVar7 = lVar6 * lVar6;
        if (9 < uVar7) {
          local_aa8.fElem = (double *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
        }
      }
      local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_01815f48;
      iVar5 = TPZGeoElSide::Dimension(&local_ac8);
      bVar4 = MapToNeighSide<double>
                        (this,iVar11,iVar5,par,&local_980.super_TPZVec<double>,&local_2d0);
      if (bVar4) {
        Neighbour((TPZGeoElSide *)&local_5f0,this,iVar11,gmesh);
        TPZGeoElSide::X((TPZGeoElSide *)&local_5f0,&local_980.super_TPZVec<double>,
                        &local_910.super_TPZVec<double>);
        Neighbour((TPZGeoElSide *)&local_5f0,this,iVar11,gmesh);
        TPZGeoElSide::Jacobian
                  ((TPZGeoElSide *)&local_5f0,&local_980.super_TPZVec<double>,&local_7b0,&local_110,
                   &local_ab0,&local_aa8);
        TPZFMatrix<double>::Transpose(&local_110);
        TPZMatrix<double>::Multiply(&local_110.super_TPZMatrix<double>,&local_7b0,&local_1f0,0);
        TPZMatrix<double>::Multiply(&local_1f0.super_TPZMatrix<double>,&local_2d0,&local_7b0,0);
        local_5f0.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
        TPZManVector<double,_3>::TPZManVector(&local_948,2,(double *)&local_5f0);
        if (local_9c8.super_TPZVec<int>.fNElements < 1) {
          local_b28 = 0.0;
        }
        else {
          local_b28 = 0.0;
          lVar6 = 0;
          do {
            TPZManVector<double,_10>::TPZManVector(&local_5f0,par->fNElements);
            pztopology::TPZTriangle::TShape<double>
                      (&local_5f0.super_TPZVec<double>,&local_428,&local_580);
            lVar8 = (long)local_9c8.super_TPZVec<int>.fStore[lVar6];
            if (((lVar8 < 0) ||
                (local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8)) ||
               (local_428.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_b28 = local_b28 + local_428.fElem[lVar8];
            lVar8 = 0;
            bVar4 = true;
            do {
              bVar10 = bVar4;
              iVar11 = local_9c8.super_TPZVec<int>.fStore[lVar6];
              if (((local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
                  (iVar11 < 0)) ||
                 (local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= iVar11)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_948.super_TPZVec<double>.fStore[lVar8] =
                   local_580.fElem
                   [iVar11 * local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + lVar8] +
                   local_948.super_TPZVec<double>.fStore[lVar8];
              lVar8 = 1;
              bVar4 = false;
            } while (bVar10);
            TPZManVector<double,_10>::~TPZManVector(&local_5f0);
            lVar6 = lVar6 + 1;
          } while (lVar6 < local_9c8.super_TPZVec<int>.fNElements);
        }
        lVar6 = 0;
        do {
          lVar8 = 0;
          bVar4 = true;
          do {
            bVar10 = bVar4;
            if ((local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
               (local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar8)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
               (local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar8)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_890.fElem
            [local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8 + lVar6] =
                 (1.0 - local_6d0.super_TPZVec<double>.fStore[uVar12]) *
                 (local_7b0.fElem
                  [local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8 + lVar6] *
                  local_b28 +
                 local_910.super_TPZVec<double>.fStore[lVar6] *
                 local_948.super_TPZVec<double>.fStore[lVar8]) +
                 local_890.fElem
                 [local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8 + lVar6];
            lVar8 = 1;
            bVar4 = false;
          } while (bVar10);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        if (0 < local_8d8.super_TPZVec<int>.fNElements) {
          lVar6 = 0;
          do {
            local_6d0.super_TPZVec<double>.fStore[local_8d8.super_TPZVec<int>.fStore[lVar6]] =
                 (1.0 - local_6d0.super_TPZVec<double>.fStore[uVar12]) +
                 local_6d0.super_TPZVec<double>.fStore[local_8d8.super_TPZVec<int>.fStore[lVar6]];
            lVar6 = lVar6 + 1;
          } while (local_8d8.super_TPZVec<int>.fNElements != lVar6);
        }
        TPZManVector<double,_3>::~TPZManVector(&local_948);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_aa8,&PTR_PTR_01816200);
    }
    bVar4 = 3 < uVar12;
    uVar12 = uVar12 - 1;
  } while (bVar4);
  lVar6 = 0;
  do {
    lVar8 = 0;
    do {
      lVar9 = 0;
      bVar4 = true;
      do {
        bVar10 = bVar4;
        lVar2 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar2 <= lVar8) || ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)
           ) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
           (local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
           (local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_890.fElem[local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9 + lVar8]
             = (1.0 - local_6d0.super_TPZVec<double>.fStore[lVar6]) *
               coord->fElem[lVar2 * lVar6 + lVar8] *
               local_580.fElem
               [local_580.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6 + lVar9] +
               local_890.fElem
               [local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9 + lVar8];
        lVar9 = 1;
        bVar4 = false;
      } while (bVar10);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_aa8.fElem = local_a18;
  local_aa8.fSize = 9;
  local_aa8.fGiven = local_aa8.fElem;
  TPZVec<int>::TPZVec(&local_aa8.fPivot.super_TPZVec<int>,0);
  local_aa8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_aa8.fPivot.super_TPZVec<int>.fStore = local_aa8.fPivot.fExtAlloc;
  local_aa8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_aa8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_aa8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_aa8.fWork.fStore = (double *)0x0;
  local_aa8.fWork.fNElements = 0;
  local_aa8.fWork.fNAlloc = 0;
  local_aa8.fElem = (double *)0x0;
  local_aa8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  TPZFMatrix<double>::GramSchmidt(&local_890,&local_aa8,jacobian);
  TPZFMatrix<double>::Transpose(&local_aa8,&axes->super_TPZMatrix<double>);
  (*(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (jacinv,(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
             (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar8 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar8 < 1 || lVar6 < 1) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3 = jacobian->fElem;
  if (lVar8 < 2 || lVar6 < 2) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar6 < 2) || (lVar8 < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar6 < 1) || (lVar8 < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar13 = *pdVar3 * pdVar3[lVar6 + 1] - pdVar3[1] * pdVar3[lVar6];
  uVar12 = -(ulong)(ABS(dVar13) < 1e-12);
  dVar13 = (double)(uVar12 & 0x3d719799812dea11 | ~uVar12 & (ulong)dVar13);
  *detjac = dVar13;
  if ((lVar6 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *jacinv->fElem = pdVar3[lVar6 + 1] / dVar13;
  if ((lVar6 < 1) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((1 < lVar6) && (1 < (jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    jacinv->fElem[lVar6 + 1] = *jacobian->fElem / *detjac;
    lVar8 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar8 < 1) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar6 < 1) || ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    jacinv->fElem[lVar6] = -jacobian->fElem[lVar8] / *detjac;
    if ((1 < lVar8) && (0 < (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      if ((1 < lVar6) && (0 < (jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
        jacinv->fElem[1] = -jacobian->fElem[1] / *detjac;
        TPZFMatrix<double>::~TPZFMatrix(&local_aa8,&PTR_PTR_01816200);
        TPZFMatrix<double>::~TPZFMatrix(&local_2d0,&PTR_PTR_01816200);
        TPZFMatrix<double>::~TPZFMatrix(&local_890,&PTR_PTR_01816200);
        TPZFMatrix<double>::~TPZFMatrix(&local_110,&PTR_PTR_01816200);
        TPZFMatrix<double>::~TPZFMatrix(&local_1f0,&PTR_PTR_01816200);
        TPZFMatrix<double>::~TPZFMatrix(&local_7b0,&PTR_PTR_01816200);
        TPZFMatrix<double>::~TPZFMatrix(&local_580,&PTR_PTR_01885258);
        TPZFMatrix<double>::~TPZFMatrix(&local_428,&PTR_PTR_01885258);
        TPZManVector<int,_10>::~TPZManVector(&local_8d8);
        TPZManVector<int,_10>::~TPZManVector(&local_9c8);
        TPZManVector<double,_10>::~TPZManVector(&local_6d0);
        TPZManVector<double,_3>::~TPZManVector(&local_660);
        TPZManVector<double,_3>::~TPZManVector(&local_910);
        TPZManVector<double,_3>::~TPZManVector(&local_628);
        TPZManVector<double,_3>::~TPZManVector(&local_980);
        return;
      }
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Jacobian(TPZFMatrix<REAL> &coord, TPZVec<REAL>& par, TPZFMatrix<REAL> &jacobian, TPZFMatrix<REAL> &axes,REAL &detjac,TPZFMatrix<REAL> &jacinv) const
{

    TPZGeoEl &gel = *fGeoEl;
    TPZManVector<REAL,3> NeighPar, SidePar, Xside(3,0.), XNode(3,0.);
    int majorSide = TGeo::NSides - 1;
	
    TPZManVector<REAL> SidesCounter(TGeo::NSides,0);
    TPZStack<int> LowNodeSides, LowAllSides;
	
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "input parameter par " << par;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    TPZFNMatrix<24> blend(TGeo::NNodes,1), Dblend(TGeo::Dimension,TGeo::NNodes);
    TGeo::Shape(par,blend,Dblend);
	
    TPZFNMatrix<9> J1, J2, Ax, JacTemp(3,TGeo::Dimension, 0.), Jneighbourhood;
    REAL Det;
    TPZGeoMesh *gmesh = gel.Mesh();
    for(int byside = majorSide; byside >= TGeo::NNodes; byside--)
    {
        TPZGeoElSide neighbyside = Neighbour(byside, gmesh);
        if(neighbyside.Exists())
        {
            TGeo::LowerDimensionSides(byside,LowNodeSides,0);
            TGeo::LowerDimensionSides(byside,LowAllSides);
            int dim = Neighbour(byside, gmesh).Dimension();
            TPZFNMatrix<9> Inv(dim,dim);
            int sidedim = neighbyside.Dimension();
            if(!MapToNeighSide(byside,sidedim,par,NeighPar, Jneighbourhood))
			{
				continue;
			}
            Neighbour(byside,gmesh).X(NeighPar,Xside);
            Neighbour(byside,gmesh).Jacobian(NeighPar,J1,Ax,Det,Inv);
            Ax.Transpose(); 
            Ax.Multiply(J1,J2);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "byside " << byside << std::endl;
        		sout << "side of the neighbour " << Neighbour(byside,gmesh).Side() << std::endl;
        		Neighbour(byside,gmesh).Element()->Print(sout);
				sout << "neighbour parameter(NeighPar) " << NeighPar << std::endl;
				sout << "Jacobian of the map(Jneighborhood) " << Jneighbourhood << std::endl;
				sout << "Xside " << Xside << std::endl;
				sout << "jacobian neighbour(J1) " << J1 << std::endl;
        		Ax.Print("Ax of the neighbour (Ax) ",sout);
				sout << "jacobian of the neighbour multiplied by the axes(J2) " << J2 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            J2.Multiply(Jneighbourhood,J1);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "acumulated jacobian(J1) " << J1 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            REAL blendTemp = 0.; 
            TPZManVector<REAL,3> DblendTemp(TGeo::Dimension,0.);
            for(int a = 0; a < LowNodeSides.NElements(); a++)
            {
                TPZManVector<REAL> parChanged(par.NElements());
                TGeo::Shape(parChanged,blend,Dblend);
				
                blendTemp += blend(LowNodeSides[a],0);
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    DblendTemp[b] += Dblend(b,LowNodeSides[a]);
                }
            }
			
            for(int a = 0; a < 3; a++)
            {
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    JacTemp(a,b) += (1 - SidesCounter[byside]) * (J1(a,b)*blendTemp + Xside[a]*DblendTemp[b]);
                }
            }
            for(int a = 0; a < LowAllSides.NElements(); a++) 
            {
                SidesCounter[LowAllSides[a]] += (1 - SidesCounter[byside]);
            }
        }
    }
	
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		JacTemp.Print("Jabobian before contributing the nodes",sout);
		sout << "SidesCounter " << SidesCounter << std::endl;
		sout << "DBlend " << Dblend << std::endl;
		sout << "NodeCoord " << coord << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    for(int a = 0; a < TGeo::NNodes; a++)
    {
        for(int b = 0; b < 3; b++) 
        { 
            for(int c = 0; c < TGeo::Dimension; c++)
            {
            	JacTemp(b,c) += (1 - SidesCounter[a]) * coord(b,a)*Dblend(c,a);
            }
        }
    }
	
    if(TGeo::Dimension == 1)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        detjac = jacobian(0,0);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) = 1./detjac;
    } else if(TGeo::Dimension == 2)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        detjac = jacobian(0,0)*jacobian(1,1) - jacobian(1,0)*jacobian(0,1);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) =  jacobian(1,1) / detjac;
        jacinv(1,1) =  jacobian(0,0) / detjac;
        jacinv(0,1) = -jacobian(0,1) / detjac;
        jacinv(1,0) = -jacobian(1,0) / detjac;
    }
    else
    {
        jacobian = JacTemp;
        axes.Resize(3,3); axes.Zero();
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        axes(0,0) = 1.; axes(1,1) = 1.; axes(2,2) = 1.;
        detjac = -jacobian(0,2)*jacobian(1,1)*jacobian(2,0);//- a02 a11 a20
        detjac += jacobian(0,1)*jacobian(1,2)*jacobian(2,0);//+ a01 a12 a20
        detjac += jacobian(0,2)*jacobian(1,0)*jacobian(2,1);//+ a02 a10 a21
        detjac -= jacobian(0,0)*jacobian(1,2)*jacobian(2,1);//- a00 a12 a21
        detjac -= jacobian(0,1)*jacobian(1,0)*jacobian(2,2);//- a01 a10 a22
        detjac += jacobian(0,0)*jacobian(1,1)*jacobian(2,2);//+ a00 a11 a22
        
        if(IsZero(detjac))
		{
#ifdef PZ_LOG
            if(logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Singular Jacobian " << detjac;
                LOGPZ_ERROR(logger, sout.str())
            }
#endif
			detjac = ZeroTolerance();
		}
        
        jacinv(0,0) = (-jacobian(1,2)*jacobian(2,1)+jacobian(1,1)*jacobian(2,2)) / detjac;//-a12 a21 + a11 a22
        jacinv(0,1) = ( jacobian(0,2)*jacobian(2,1)-jacobian(0,1)*jacobian(2,2)) / detjac;// a02 a21 - a01 a22
        jacinv(0,2) = (-jacobian(0,2)*jacobian(1,1)+jacobian(0,1)*jacobian(1,2)) / detjac;//-a02 a11 + a01 a12
        jacinv(1,0) = ( jacobian(1,2)*jacobian(2,0)-jacobian(1,0)*jacobian(2,2)) / detjac;// a12 a20 - a10 a22
        jacinv(1,1) = (-jacobian(0,2)*jacobian(2,0)+jacobian(0,0)*jacobian(2,2)) / detjac;//-a02 a20 + a00 a22
        jacinv(1,2) = ( jacobian(0,2)*jacobian(1,0)-jacobian(0,0)*jacobian(1,2)) / detjac;// a02 a10 - a00 a12
        jacinv(2,0) = (-jacobian(1,1)*jacobian(2,0)+jacobian(1,0)*jacobian(2,1)) / detjac;//-a11 a20 + a10 a21
        jacinv(2,1) = ( jacobian(0,1)*jacobian(2,0)-jacobian(0,0)*jacobian(2,1)) / detjac;// a01 a20 - a00 a21
        jacinv(2,2) = (-jacobian(0,1)*jacobian(1,0)+jacobian(0,0)*jacobian(1,1)) / detjac;//-a01 a10 + a00 a11
    }
}